

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

void helicsBrokerDisconnect(HelicsBroker broker,HelicsError *err)

{
  Broker *pBVar1;
  
  pBVar1 = getBroker(broker,err);
  if (pBVar1 != (Broker *)0x0) {
    (*pBVar1->_vptr_Broker[3])(pBVar1);
  }
  return;
}

Assistant:

void helicsBrokerDisconnect(HelicsBroker broker, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    try {
        brk->disconnect();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}